

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_scv.c
# Opt level: O0

void scv(void)

{
  int iVar1;
  greatest_test_res gVar2;
  greatest_test_res res_90;
  greatest_test_res res_89;
  greatest_test_res res_88;
  greatest_test_res res_87;
  greatest_test_res res_86;
  greatest_test_res res_85;
  greatest_test_res res_84;
  greatest_test_res res_83;
  greatest_test_res res_82;
  greatest_test_res res_81;
  greatest_test_res res_80;
  greatest_test_res res_79;
  greatest_test_res res_78;
  greatest_test_res res_77;
  greatest_test_res res_76;
  greatest_test_res res_75;
  greatest_test_res res_74;
  greatest_test_res res_73;
  greatest_test_res res_72;
  greatest_test_res res_71;
  greatest_test_res res_70;
  greatest_test_res res_69;
  greatest_test_res res_68;
  greatest_test_res res_67;
  greatest_test_res res_66;
  greatest_test_res res_65;
  greatest_test_res res_64;
  greatest_test_res res_63;
  greatest_test_res res_62;
  greatest_test_res res_61;
  greatest_test_res res_60;
  greatest_test_res res_59;
  greatest_test_res res_58;
  greatest_test_res res_57;
  greatest_test_res res_56;
  greatest_test_res res_55;
  greatest_test_res res_54;
  greatest_test_res res_53;
  greatest_test_res res_52;
  greatest_test_res res_51;
  greatest_test_res res_50;
  greatest_test_res res_49;
  greatest_test_res res_48;
  greatest_test_res res_47;
  greatest_test_res res_46;
  greatest_test_res res_45;
  greatest_test_res res_44;
  greatest_test_res res_43;
  greatest_test_res res_42;
  greatest_test_res res_41;
  greatest_test_res res_40;
  greatest_test_res res_39;
  greatest_test_res res_38;
  greatest_test_res res_37;
  greatest_test_res res_36;
  greatest_test_res res_35;
  greatest_test_res res_34;
  greatest_test_res res_33;
  greatest_test_res res_32;
  greatest_test_res res_31;
  greatest_test_res res_30;
  greatest_test_res res_29;
  greatest_test_res res_28;
  greatest_test_res res_27;
  greatest_test_res res_26;
  greatest_test_res res_25;
  greatest_test_res res_24;
  greatest_test_res res_23;
  greatest_test_res res_22;
  greatest_test_res res_21;
  greatest_test_res res_20;
  greatest_test_res res_19;
  greatest_test_res res_18;
  greatest_test_res res_17;
  greatest_test_res res_16;
  greatest_test_res res_15;
  greatest_test_res res_14;
  greatest_test_res res_13;
  greatest_test_res res_12;
  greatest_test_res res_11;
  greatest_test_res res_10;
  greatest_test_res res_9;
  greatest_test_res res_8;
  greatest_test_res res_7;
  greatest_test_res res_6;
  greatest_test_res res_5;
  greatest_test_res res_4;
  greatest_test_res res_3;
  greatest_test_res res_2;
  greatest_test_res res_1;
  greatest_test_res res;
  
  iVar1 = greatest_test_pre("new_objsize_zero");
  if (iVar1 == 1) {
    gVar2 = new_objsize_zero();
    greatest_test_post(gVar2);
  }
  iVar1 = greatest_test_pre("new_capacity_zero");
  if (iVar1 == 1) {
    gVar2 = new_capacity_zero();
    greatest_test_post(gVar2);
  }
  iVar1 = greatest_test_pre("new_objsize_max");
  if (iVar1 == 1) {
    gVar2 = new_objsize_max();
    greatest_test_post(gVar2);
  }
  iVar1 = greatest_test_pre("new_capacity_max");
  if (iVar1 == 1) {
    gVar2 = new_capacity_max();
    greatest_test_post(gVar2);
  }
  iVar1 = greatest_test_pre("delete_null");
  if (iVar1 == 1) {
    gVar2 = delete_null();
    greatest_test_post(gVar2);
  }
  iVar1 = greatest_test_pre("at_inside");
  if (iVar1 == 1) {
    gVar2 = at_inside();
    greatest_test_post(gVar2);
  }
  iVar1 = greatest_test_pre("at_outside");
  if (iVar1 == 1) {
    gVar2 = at_outside();
    greatest_test_post(gVar2);
  }
  iVar1 = greatest_test_pre("at_empty");
  if (iVar1 == 1) {
    gVar2 = at_empty();
    greatest_test_post(gVar2);
  }
  iVar1 = greatest_test_pre("front_nonempty");
  if (iVar1 == 1) {
    gVar2 = front_nonempty();
    greatest_test_post(gVar2);
  }
  iVar1 = greatest_test_pre("front_empty");
  if (iVar1 == 1) {
    gVar2 = front_empty();
    greatest_test_post(gVar2);
  }
  iVar1 = greatest_test_pre("back_nonempty");
  if (iVar1 == 1) {
    gVar2 = back_nonempty();
    greatest_test_post(gVar2);
  }
  iVar1 = greatest_test_pre("back_single");
  if (iVar1 == 1) {
    gVar2 = back_single();
    greatest_test_post(gVar2);
  }
  iVar1 = greatest_test_pre("back_empty");
  if (iVar1 == 1) {
    gVar2 = back_empty();
    greatest_test_post(gVar2);
  }
  iVar1 = greatest_test_pre("data_nonempty");
  if (iVar1 == 1) {
    gVar2 = data_nonempty();
    greatest_test_post(gVar2);
  }
  iVar1 = greatest_test_pre("data_empty");
  if (iVar1 == 1) {
    gVar2 = data_empty();
    greatest_test_post(gVar2);
  }
  iVar1 = greatest_test_pre("empty_empty");
  if (iVar1 == 1) {
    gVar2 = empty_empty();
    greatest_test_post(gVar2);
  }
  iVar1 = greatest_test_pre("empty_nonempty");
  if (iVar1 == 1) {
    gVar2 = empty_nonempty();
    greatest_test_post(gVar2);
  }
  iVar1 = greatest_test_pre("size_empty");
  if (iVar1 == 1) {
    gVar2 = size_empty();
    greatest_test_post(gVar2);
  }
  iVar1 = greatest_test_pre("size_nonempty");
  if (iVar1 == 1) {
    gVar2 = size_nonempty();
    greatest_test_post(gVar2);
  }
  iVar1 = greatest_test_pre("objsize");
  if (iVar1 == 1) {
    gVar2 = objsize();
    greatest_test_post(gVar2);
  }
  iVar1 = greatest_test_pre("reserve_zero");
  if (iVar1 == 1) {
    gVar2 = reserve_zero();
    greatest_test_post(gVar2);
  }
  iVar1 = greatest_test_pre("reserve_below_size");
  if (iVar1 == 1) {
    gVar2 = reserve_below_size();
    greatest_test_post(gVar2);
  }
  iVar1 = greatest_test_pre("reserve_equals_size");
  if (iVar1 == 1) {
    gVar2 = reserve_equals_size();
    greatest_test_post(gVar2);
  }
  iVar1 = greatest_test_pre("reserve_above_size");
  if (iVar1 == 1) {
    gVar2 = reserve_above_size();
    greatest_test_post(gVar2);
  }
  iVar1 = greatest_test_pre("reserve_above_capacity");
  if (iVar1 == 1) {
    gVar2 = reserve_above_capacity();
    greatest_test_post(gVar2);
  }
  iVar1 = greatest_test_pre("reserve_capacity_max");
  if (iVar1 == 1) {
    gVar2 = reserve_capacity_max();
    greatest_test_post(gVar2);
  }
  iVar1 = greatest_test_pre("capacity");
  if (iVar1 == 1) {
    gVar2 = capacity();
    greatest_test_post(gVar2);
  }
  iVar1 = greatest_test_pre("shrink_to_fit_empty");
  if (iVar1 == 1) {
    gVar2 = shrink_to_fit_empty();
    greatest_test_post(gVar2);
  }
  iVar1 = greatest_test_pre("shrink_to_fit_size_equals_capacity");
  if (iVar1 == 1) {
    gVar2 = shrink_to_fit_size_equals_capacity();
    greatest_test_post(gVar2);
  }
  iVar1 = greatest_test_pre("shrink_to_fit_size_below_capacity");
  if (iVar1 == 1) {
    gVar2 = shrink_to_fit_size_below_capacity();
    greatest_test_post(gVar2);
  }
  iVar1 = greatest_test_pre("clear_nonempty");
  if (iVar1 == 1) {
    gVar2 = clear_nonempty();
    greatest_test_post(gVar2);
  }
  iVar1 = greatest_test_pre("clear_empty");
  if (iVar1 == 1) {
    gVar2 = clear_empty();
    greatest_test_post(gVar2);
  }
  iVar1 = greatest_test_pre("assign_empty_and_nonempty");
  if (iVar1 == 1) {
    gVar2 = assign_empty_and_nonempty();
    greatest_test_post(gVar2);
  }
  iVar1 = greatest_test_pre("assign_less");
  if (iVar1 == 1) {
    gVar2 = assign_less();
    greatest_test_post(gVar2);
  }
  iVar1 = greatest_test_pre("assign_more");
  if (iVar1 == 1) {
    gVar2 = assign_more();
    greatest_test_post(gVar2);
  }
  iVar1 = greatest_test_pre("assign_null_data");
  if (iVar1 == 1) {
    gVar2 = assign_null_data();
    greatest_test_post(gVar2);
  }
  iVar1 = greatest_test_pre("assign_growing_capacity");
  if (iVar1 == 1) {
    gVar2 = assign_growing_capacity();
    greatest_test_post(gVar2);
  }
  iVar1 = greatest_test_pre("assign_nobj_max");
  if (iVar1 == 1) {
    gVar2 = assign_nobj_max();
    greatest_test_post(gVar2);
  }
  iVar1 = greatest_test_pre("replace_empty_vector");
  if (iVar1 == 1) {
    gVar2 = replace_empty_vector();
    greatest_test_post(gVar2);
  }
  iVar1 = greatest_test_pre("replace_empty_range_start");
  if (iVar1 == 1) {
    gVar2 = replace_empty_range_start();
    greatest_test_post(gVar2);
  }
  iVar1 = greatest_test_pre("replace_empty_range_middle");
  if (iVar1 == 1) {
    gVar2 = replace_empty_range_middle();
    greatest_test_post(gVar2);
  }
  iVar1 = greatest_test_pre("replace_empty_range_end");
  if (iVar1 == 1) {
    gVar2 = replace_empty_range_end();
    greatest_test_post(gVar2);
  }
  iVar1 = greatest_test_pre("replace_start");
  if (iVar1 == 1) {
    gVar2 = replace_start();
    greatest_test_post(gVar2);
  }
  iVar1 = greatest_test_pre("replace_middle");
  if (iVar1 == 1) {
    gVar2 = replace_middle();
    greatest_test_post(gVar2);
  }
  iVar1 = greatest_test_pre("replace_end");
  if (iVar1 == 1) {
    gVar2 = replace_end();
    greatest_test_post(gVar2);
  }
  iVar1 = greatest_test_pre("replace_start_with_nothing");
  if (iVar1 == 1) {
    gVar2 = replace_start_with_nothing();
    greatest_test_post(gVar2);
  }
  iVar1 = greatest_test_pre("replace_middle_with_nothing");
  if (iVar1 == 1) {
    gVar2 = replace_middle_with_nothing();
    greatest_test_post(gVar2);
  }
  iVar1 = greatest_test_pre("replace_end_with_nothing");
  if (iVar1 == 1) {
    gVar2 = replace_end_with_nothing();
    greatest_test_post(gVar2);
  }
  iVar1 = greatest_test_pre("replace_with_less");
  if (iVar1 == 1) {
    gVar2 = replace_with_less();
    greatest_test_post(gVar2);
  }
  iVar1 = greatest_test_pre("replace_with_more");
  if (iVar1 == 1) {
    gVar2 = replace_with_more();
    greatest_test_post(gVar2);
  }
  iVar1 = greatest_test_pre("replace_all_with_less");
  if (iVar1 == 1) {
    gVar2 = replace_all_with_less();
    greatest_test_post(gVar2);
  }
  iVar1 = greatest_test_pre("replace_all_with_more");
  if (iVar1 == 1) {
    gVar2 = replace_all_with_more();
    greatest_test_post(gVar2);
  }
  iVar1 = greatest_test_pre("replace_with_null_data");
  if (iVar1 == 1) {
    gVar2 = replace_with_null_data();
    greatest_test_post(gVar2);
  }
  iVar1 = greatest_test_pre("replace_growing_capacity");
  if (iVar1 == 1) {
    gVar2 = replace_growing_capacity();
    greatest_test_post(gVar2);
  }
  iVar1 = greatest_test_pre("replace_nobj_max");
  if (iVar1 == 1) {
    gVar2 = replace_nobj_max();
    greatest_test_post(gVar2);
  }
  iVar1 = greatest_test_pre("replace_outside_range");
  if (iVar1 == 1) {
    gVar2 = replace_outside_range();
    greatest_test_post(gVar2);
  }
  iVar1 = greatest_test_pre("replace_negative_range");
  if (iVar1 == 1) {
    gVar2 = replace_negative_range();
    greatest_test_post(gVar2);
  }
  iVar1 = greatest_test_pre("insert_empty_vector");
  if (iVar1 == 1) {
    gVar2 = insert_empty_vector();
    greatest_test_post(gVar2);
  }
  iVar1 = greatest_test_pre("insert_start");
  if (iVar1 == 1) {
    gVar2 = insert_start();
    greatest_test_post(gVar2);
  }
  iVar1 = greatest_test_pre("insert_middle");
  if (iVar1 == 1) {
    gVar2 = insert_middle();
    greatest_test_post(gVar2);
  }
  iVar1 = greatest_test_pre("insert_end");
  if (iVar1 == 1) {
    gVar2 = insert_end();
    greatest_test_post(gVar2);
  }
  iVar1 = greatest_test_pre("insert_nothing");
  if (iVar1 == 1) {
    gVar2 = insert_nothing();
    greatest_test_post(gVar2);
  }
  iVar1 = greatest_test_pre("insert_null_data");
  if (iVar1 == 1) {
    gVar2 = insert_null_data();
    greatest_test_post(gVar2);
  }
  iVar1 = greatest_test_pre("insert_growing_capacity");
  if (iVar1 == 1) {
    gVar2 = insert_growing_capacity();
    greatest_test_post(gVar2);
  }
  iVar1 = greatest_test_pre("insert_nobj_max");
  if (iVar1 == 1) {
    gVar2 = insert_nobj_max();
    greatest_test_post(gVar2);
  }
  iVar1 = greatest_test_pre("insert_outside_range");
  if (iVar1 == 1) {
    gVar2 = insert_outside_range();
    greatest_test_post(gVar2);
  }
  iVar1 = greatest_test_pre("erase_nothing");
  if (iVar1 == 1) {
    gVar2 = erase_nothing();
    greatest_test_post(gVar2);
  }
  iVar1 = greatest_test_pre("erase_start");
  if (iVar1 == 1) {
    gVar2 = erase_start();
    greatest_test_post(gVar2);
  }
  iVar1 = greatest_test_pre("erase_middle");
  if (iVar1 == 1) {
    gVar2 = erase_middle();
    greatest_test_post(gVar2);
  }
  iVar1 = greatest_test_pre("erase_end");
  if (iVar1 == 1) {
    gVar2 = erase_end();
    greatest_test_post(gVar2);
  }
  iVar1 = greatest_test_pre("erase_all");
  if (iVar1 == 1) {
    gVar2 = erase_all();
    greatest_test_post(gVar2);
  }
  iVar1 = greatest_test_pre("erase_outside_range");
  if (iVar1 == 1) {
    gVar2 = erase_outside_range();
    greatest_test_post(gVar2);
  }
  iVar1 = greatest_test_pre("erase_negative_range");
  if (iVar1 == 1) {
    gVar2 = erase_negative_range();
    greatest_test_post(gVar2);
  }
  iVar1 = greatest_test_pre("push_back_empty");
  if (iVar1 == 1) {
    gVar2 = push_back_empty();
    greatest_test_post(gVar2);
  }
  iVar1 = greatest_test_pre("push_back");
  if (iVar1 == 1) {
    gVar2 = push_back();
    greatest_test_post(gVar2);
  }
  iVar1 = greatest_test_pre("push_back_growing_capacity");
  if (iVar1 == 1) {
    gVar2 = push_back_growing_capacity();
    greatest_test_post(gVar2);
  }
  iVar1 = greatest_test_pre("pop_back");
  if (iVar1 == 1) {
    gVar2 = pop_back();
    greatest_test_post(gVar2);
  }
  iVar1 = greatest_test_pre("pop_back_empty");
  if (iVar1 == 1) {
    gVar2 = pop_back_empty();
    greatest_test_post(gVar2);
  }
  iVar1 = greatest_test_pre("resize_zero_size");
  if (iVar1 == 1) {
    gVar2 = resize_zero_size();
    greatest_test_post(gVar2);
  }
  iVar1 = greatest_test_pre("resize_smaller_size");
  if (iVar1 == 1) {
    gVar2 = resize_smaller_size();
    greatest_test_post(gVar2);
  }
  iVar1 = greatest_test_pre("resize_equal_size");
  if (iVar1 == 1) {
    gVar2 = resize_equal_size();
    greatest_test_post(gVar2);
  }
  iVar1 = greatest_test_pre("resize_larger_size");
  if (iVar1 == 1) {
    gVar2 = resize_larger_size();
    greatest_test_post(gVar2);
  }
  iVar1 = greatest_test_pre("resize_larger_capacity");
  if (iVar1 == 1) {
    gVar2 = resize_larger_capacity();
    greatest_test_post(gVar2);
  }
  iVar1 = greatest_test_pre("resize_size_max");
  if (iVar1 == 1) {
    gVar2 = resize_size_max();
    greatest_test_post(gVar2);
  }
  iVar1 = greatest_test_pre("copy_empty_to_empty");
  if (iVar1 == 1) {
    gVar2 = copy_empty_to_empty();
    greatest_test_post(gVar2);
  }
  iVar1 = greatest_test_pre("copy_empty_to_nonempty");
  if (iVar1 == 1) {
    gVar2 = copy_empty_to_nonempty();
    greatest_test_post(gVar2);
  }
  iVar1 = greatest_test_pre("copy_nonempty_to_empty");
  if (iVar1 == 1) {
    gVar2 = copy_nonempty_to_empty();
    greatest_test_post(gVar2);
  }
  iVar1 = greatest_test_pre("copy_nonempty_to_nonempty");
  if (iVar1 == 1) {
    gVar2 = copy_nonempty_to_nonempty();
    greatest_test_post(gVar2);
  }
  iVar1 = greatest_test_pre("copy_objsize_mismatch");
  if (iVar1 == 1) {
    gVar2 = copy_objsize_mismatch();
    greatest_test_post(gVar2);
  }
  iVar1 = greatest_test_pre("copy_to_itself");
  if (iVar1 == 1) {
    gVar2 = copy_to_itself();
    greatest_test_post(gVar2);
  }
  iVar1 = greatest_test_pre("swap");
  if (iVar1 == 1) {
    gVar2 = swap();
    greatest_test_post(gVar2);
  }
  return;
}

Assistant:

SUITE(scv)
{
	RUN_TEST(new_objsize_zero);
	RUN_TEST(new_capacity_zero);
	RUN_TEST(new_objsize_max);
	RUN_TEST(new_capacity_max);

	RUN_TEST(delete_null);

	RUN_TEST(at_inside);
	RUN_TEST(at_outside);
	RUN_TEST(at_empty);

	RUN_TEST(front_nonempty);
	RUN_TEST(front_empty);

	RUN_TEST(back_nonempty);
	RUN_TEST(back_single);
	RUN_TEST(back_empty);

	RUN_TEST(data_nonempty);
	RUN_TEST(data_empty);

	RUN_TEST(empty_empty);
	RUN_TEST(empty_nonempty);

	RUN_TEST(size_empty);
	RUN_TEST(size_nonempty);

	RUN_TEST(objsize);

	RUN_TEST(reserve_zero);
	RUN_TEST(reserve_below_size);
	RUN_TEST(reserve_equals_size);
	RUN_TEST(reserve_above_size);
	RUN_TEST(reserve_above_capacity);
	RUN_TEST(reserve_capacity_max);

	RUN_TEST(capacity);

	RUN_TEST(shrink_to_fit_empty);
	RUN_TEST(shrink_to_fit_size_equals_capacity);
	RUN_TEST(shrink_to_fit_size_below_capacity);

	RUN_TEST(clear_nonempty);
	RUN_TEST(clear_empty);

	RUN_TEST(assign_empty_and_nonempty);
	RUN_TEST(assign_less);
	RUN_TEST(assign_more);
	RUN_TEST(assign_null_data);
	RUN_TEST(assign_growing_capacity);
	RUN_TEST(assign_nobj_max);

	RUN_TEST(replace_empty_vector);
	RUN_TEST(replace_empty_range_start);
	RUN_TEST(replace_empty_range_middle);
	RUN_TEST(replace_empty_range_end);
	RUN_TEST(replace_start);
	RUN_TEST(replace_middle);
	RUN_TEST(replace_end);
	RUN_TEST(replace_start_with_nothing);
	RUN_TEST(replace_middle_with_nothing);
	RUN_TEST(replace_end_with_nothing);
	RUN_TEST(replace_with_less);
	RUN_TEST(replace_with_more);
	RUN_TEST(replace_all_with_less);
	RUN_TEST(replace_all_with_more);
	RUN_TEST(replace_with_null_data);
	RUN_TEST(replace_growing_capacity);
	RUN_TEST(replace_nobj_max);
	RUN_TEST(replace_outside_range);
	RUN_TEST(replace_negative_range);

	RUN_TEST(insert_empty_vector);
	RUN_TEST(insert_start);
	RUN_TEST(insert_middle);
	RUN_TEST(insert_end);
	RUN_TEST(insert_nothing);
	RUN_TEST(insert_null_data);
	RUN_TEST(insert_growing_capacity);
	RUN_TEST(insert_nobj_max);
	RUN_TEST(insert_outside_range);

	RUN_TEST(erase_nothing);
	RUN_TEST(erase_start);
	RUN_TEST(erase_middle);
	RUN_TEST(erase_end);
	RUN_TEST(erase_all);
	RUN_TEST(erase_outside_range);
	RUN_TEST(erase_negative_range);

	RUN_TEST(push_back_empty);
	RUN_TEST(push_back);
	RUN_TEST(push_back_growing_capacity);

	RUN_TEST(pop_back);
	RUN_TEST(pop_back_empty);

	RUN_TEST(resize_zero_size);
	RUN_TEST(resize_smaller_size);
	RUN_TEST(resize_equal_size);
	RUN_TEST(resize_larger_size);
	RUN_TEST(resize_larger_capacity);
	RUN_TEST(resize_size_max);

	RUN_TEST(copy_empty_to_empty);
	RUN_TEST(copy_empty_to_nonempty);
	RUN_TEST(copy_nonempty_to_empty);
	RUN_TEST(copy_nonempty_to_nonempty);
	RUN_TEST(copy_objsize_mismatch);
	RUN_TEST(copy_to_itself);

	RUN_TEST(swap);
}